

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O2

Vec3 __thiscall CheckerTexture::GetValue(CheckerTexture *this,float u,float v,Vec3 *pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec3 VVar4;
  Vec3 _pos;
  Vec3 local_2c;
  
  operator*(10.0,&local_2c);
  fVar1 = sinf(local_2c.e[0]);
  fVar2 = sinf(local_2c.e[1]);
  fVar3 = sinf(local_2c.e[2]);
  VVar4.e._0_8_ =
       (**(code **)(**(long **)(pos->e + (ulong)(fVar3 * fVar2 * fVar1 <= 0.0) * 2 + 2) + 0x10))
                 (u,this);
  VVar4.e[2] = v;
  return (Vec3)VVar4.e;
}

Assistant:

virtual Vec3 GetValue(float u, float v, const Vec3& pos) const override {
		
		Vec3   _pos   = 10.0f*pos;
		float  _sines = std::sin(_pos.x()) * std::sin(_pos.y()) * std::sin(_pos.z());
		
		return _sines > 0.0f ? m_odd->GetValue(u, v, pos) : m_even->GetValue(u, v, pos);
	}